

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryCommitReplacement
          (DiskHandle *this,StringPtr toPath,int fromDirFd,StringPtr fromPath,WriteMode mode,
          int *errorReason)

{
  StringPtr toPath_00;
  StringPtr fromPath_00;
  PathPtr finalName;
  Iface *pIVar1;
  Fault FVar2;
  bool bVar3;
  uint code;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  String *this_00;
  char *__old;
  char *pcVar9;
  char *pcVar10;
  StringPtr path;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr toPath_local;
  String away;
  StringPtr fromPath_local;
  Function<int_(kj::StringPtr)> local_108;
  Fault f_4;
  size_t sStack_f0;
  ArrayDisposer *local_e8;
  Fault f_8;
  Fault f_7;
  Fault f;
  uint local_a8;
  
  pcVar10 = (char *)fromPath.content.size_;
  __old = fromPath.content.ptr;
  toPath_local.content.size_ = toPath.content.size_;
  pcVar9 = toPath.content.ptr;
  toPath_local.content.ptr = pcVar9;
  fromPath_local.content.ptr = __old;
  fromPath_local.content.size_ = (size_t)pcVar10;
  if ((mode & CREATE) == 0) {
    if ((mode & MODIFY) == 0) {
      return false;
    }
LAB_004711a2:
    do {
      uVar7 = (ulong)(uint)(this->fd).fd;
      lVar6 = syscall(0x13c,(ulong)(uint)fromDirFd,__old,uVar7,pcVar9,2);
      if (-1 < lVar6) goto LAB_00471268;
      code = kj::_::Debug::getOsErrorNumber(false);
    } while (code == 0xffffffff);
    if ((int)code < 0x16) {
      if (code == 0) {
LAB_00471268:
        path.content.size_ = uVar7;
        path.content.ptr = pcVar10;
        rmrf((anon_unknown_9 *)(ulong)(uint)fromDirFd,(int)fromPath.content.ptr,path);
        return true;
      }
      if (code == 2) {
        if ((mode & CREATE) == 0) {
          return false;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,char_const(&)[122],kj::StringPtr&,kj::StringPtr&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x460,FAILED,(char *)0x0,
                   "\"rename(tmp, path) claimed path exists but \" \"renameat2(fromPath, toPath, EXCHANGE) said it doesn\'t; concurrent modification?\", fromPath, toPath"
                   ,(char (*) [122])
                    "rename(tmp, path) claimed path exists but renameat2(fromPath, toPath, EXCHANGE) said it doesn\'t; concurrent modification?"
                   ,&fromPath_local,&toPath_local);
        kj::_::Debug::Fault::~Fault(&f);
        return false;
      }
    }
    else if ((code == 0x16) || (code == 0x26)) {
      bVar3 = true;
LAB_00471295:
      if ((mode & CREATE) == 0) {
        if (!bVar3) {
          return false;
        }
        do {
          iVar4 = fstatat64((this->fd).fd,toPath_local.content.ptr,(stat64 *)&f,0x100);
          if (-1 < iVar4) goto LAB_004714ad;
          iVar4 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar4 == -1);
        if (iVar4 == 0) {
LAB_004714ad:
          toPath_00.content.size_ = toPath_local.content.size_;
          toPath_00.content.ptr = toPath_local.content.ptr;
          fromPath_00.content.size_ = fromPath_local.content.size_;
          fromPath_00.content.ptr = fromPath_local.content.ptr;
          bVar3 = tryCommitReplacement
                            (this,toPath_00,fromDirFd,fromPath_00,MODIFY|CREATE,errorReason);
          return bVar3;
        }
        if (iVar4 == 2) {
          return false;
        }
        if (iVar4 == 0x14) {
          return false;
        }
        iVar5 = 0x4df;
      }
      else {
        if (bVar3) {
          do {
            sVar8 = 0x100;
            iVar4 = fstatat64((this->fd).fd,toPath_local.content.ptr,(stat64 *)&f,0x100);
            if (-1 < iVar4) goto LAB_00471361;
            iVar4 = kj::_::Debug::getOsErrorNumber(false);
          } while (iVar4 == -1);
          if (iVar4 == 0) {
LAB_00471361:
            path_00.content.size_ = sVar8;
            path_00.content.ptr = (char *)toPath_local.content.size_;
            Path::parse((Path *)&f_4,(Path *)toPath_local.content.ptr,path_00);
            finalName.parts.size_ = sStack_f0;
            finalName.parts.ptr = &(f_4.exception)->ownFile;
            local_108.impl.ptr = (Iface *)operator_new(0x18);
            (local_108.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00627858;
            local_108.impl.ptr[1]._vptr_Iface = (_func_int **)&f;
            local_108.impl.ptr[2]._vptr_Iface = (_func_int **)this;
            local_108.impl.disposer =
                 (Disposer *)
                 &kj::_::
                  HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::{lambda(kj::StringPtr)#1}>>
                  ::instance;
            createNamedTemporary(&away,this,finalName,CREATE,&local_108);
            pIVar1 = local_108.impl.ptr;
            if (local_108.impl.ptr != (Iface *)0x0) {
              local_108.impl.ptr = (Iface *)0x0;
              (**(local_108.impl.disposer)->_vptr_Disposer)
                        (local_108.impl.disposer,
                         pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
            }
            do {
              pcVar9 = "";
              if (away.content.size_ != 0) {
                pcVar9 = away.content.ptr;
              }
              iVar4 = (this->fd).fd;
              iVar4 = renameat(iVar4,toPath_local.content.ptr,iVar4,pcVar9);
              if (-1 < iVar4) goto LAB_00471428;
              iVar4 = kj::_::Debug::getOsErrorNumber(false);
            } while (iVar4 == -1);
            if (iVar4 == 0) {
LAB_00471428:
              do {
                pcVar9 = toPath_local.content.ptr;
                iVar4 = renameat(fromDirFd,fromPath_local.content.ptr,(this->fd).fd,
                                 toPath_local.content.ptr);
                if (-1 < iVar4) goto LAB_00471456;
                iVar4 = kj::_::Debug::getOsErrorNumber(false);
              } while (iVar4 == -1);
              if (iVar4 == 0) {
LAB_00471456:
                if (away.content.size_ == 0) {
                  iVar4 = 0x4b4903;
                }
                else {
                  iVar4 = (int)away.content.ptr;
                }
                path_01.content.ptr = (char *)(away.content.size_ + (away.content.size_ == 0));
                bVar3 = true;
                path_01.content.size_ = (size_t)pcVar9;
                rmrf((anon_unknown_9 *)(ulong)(uint)(this->fd).fd,iVar4,path_01);
                goto LAB_00471780;
              }
              do {
                pcVar9 = "";
                if (away.content.size_ != 0) {
                  pcVar9 = away.content.ptr;
                }
                iVar5 = (this->fd).fd;
                iVar5 = renameat(iVar5,pcVar9,iVar5,toPath_local.content.ptr);
              } while ((iVar5 < 0) && (iVar5 = kj::_::Debug::getOsErrorNumber(false), iVar5 == -1));
              if (errorReason == (int *)0x0) {
                kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                          (&f_8,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                           ,0x4be,iVar4,"rename(fromPath, toPath)","fromPath, toPath",
                           &fromPath_local,&toPath_local);
                kj::_::Debug::Fault::~Fault(&f_8);
              }
              else {
                *errorReason = iVar4;
              }
            }
            else {
              f_7.exception = (Exception *)0x0;
              f_8.exception = (Exception *)0x0;
              kj::_::Debug::Fault::init
                        (&f_7,(EVP_PKEY_CTX *)
                              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                        );
              pcVar9 = "";
              if (away.content.size_ != 0) {
                pcVar9 = away.content.ptr;
              }
              unlinkat((this->fd).fd,pcVar9,(uint)((local_a8 & 0xf000) == 0x4000) << 9);
              kj::_::Debug::Fault::~Fault(&f_7);
            }
            bVar3 = false;
LAB_00471780:
            sVar8 = away.content.size_;
            pcVar9 = away.content.ptr;
            if (away.content.ptr != (char *)0x0) {
              away.content.ptr = (char *)0x0;
              away.content.size_ = 0;
              (**(away.content.disposer)->_vptr_ArrayDisposer)
                        (away.content.disposer,pcVar9,1,sVar8,sVar8,0);
            }
            FVar2.exception = f_4.exception;
            if (f_4.exception != (Exception *)0x0) {
              f_4.exception = (Exception *)0x0;
              (**local_e8->_vptr_ArrayDisposer)
                        (local_e8,FVar2.exception,0x18,sStack_f0,sStack_f0,
                         ArrayDisposer::Dispose_<kj::String>::destruct);
              return bVar3;
            }
            return bVar3;
          }
          this_00 = &away;
          away.content.ptr = (char *)0x0;
          f_4.exception = (Exception *)0x0;
          kj::_::Debug::Fault::init
                    ((Fault *)this_00,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          goto LAB_004716be;
        }
        do {
          iVar4 = fstatat64((this->fd).fd,toPath_local.content.ptr,(stat64 *)&f,0x100);
          if (-1 < iVar4) {
            return false;
          }
          iVar4 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar4 == -1);
        if (iVar4 == 0) {
          return false;
        }
        if ((iVar4 == 2) || (iVar4 == 0x14)) goto LAB_004714ad;
        iVar5 = 0x4d4;
      }
      this_00 = (String *)&f_4;
      kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
                (&f_4,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,iVar5,iVar4,"fstatat(fd, toPath)","toPath",&toPath_local);
      goto LAB_004716be;
    }
    if (errorReason != (int *)0x0) {
LAB_00471533:
      *errorReason = code;
      return false;
    }
    pcVar9 = "renameat2(fromPath, toPath, EXCHANGE)";
    iVar4 = 0x467;
  }
  else if ((mode & MODIFY) == 0) {
    do {
      lVar6 = syscall(0x13c,(ulong)(uint)fromDirFd,__old,(ulong)(uint)(this->fd).fd,pcVar9,1);
      if (-1 < lVar6) {
        return true;
      }
      code = kj::_::Debug::getOsErrorNumber(false);
    } while (code == 0xffffffff);
    if ((int)code < 0x16) {
      if (code == 0) {
        return true;
      }
      if (code == 0x11) {
        return false;
      }
    }
    else if ((code == 0x16) || (code == 0x26)) {
      bVar3 = false;
      goto LAB_00471295;
    }
    if (errorReason != (int *)0x0) {
      *errorReason = code;
      return false;
    }
    pcVar9 = "renameat2(fromPath, toPath, NOREPLACE)";
    iVar4 = 0x47f;
  }
  else {
    do {
      iVar4 = renameat(fromDirFd,__old,(this->fd).fd,pcVar9);
      if (-1 < iVar4) {
        return true;
      }
      code = kj::_::Debug::getOsErrorNumber(false);
    } while (code == 0xffffffff);
    if (code < 0x28) {
      if ((0x8000320000U >> ((ulong)code & 0x3f) & 1) != 0) goto LAB_004711a2;
      if ((ulong)code == 0) {
        return true;
      }
    }
    if (errorReason != (int *)0x0) goto LAB_00471533;
    pcVar9 = "rename(fromPath, toPath)";
    iVar4 = 0x440;
  }
  this_00 = (String *)&f;
  kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
            ((Fault *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,iVar4,code,pcVar9,"fromPath, toPath",&fromPath_local,&toPath_local);
LAB_004716be:
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  return false;
}

Assistant:

bool tryCommitReplacement(StringPtr toPath, int fromDirFd, StringPtr fromPath, WriteMode mode,
                            int* errorReason = nullptr) const {
    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // Always clobber. Try it.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr())) {
        case EISDIR:
        case ENOTDIR:
        case ENOTEMPTY:
        case EEXIST:
          // Failed because target exists and due to the various weird quirks of rename(), it
          // can't remove it for us. On Linux we can try an exchange instead. On others we have
          // to move the target out of the way.
          break;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) { return false; }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }

#if __linux__ && defined(RENAME_EXCHANGE) && defined(SYS_renameat2)
    // Try to use Linux's renameat2() to atomically check preconditions and apply.

    if (has(mode, WriteMode::MODIFY)) {
      // Use an exchange to implement modification.
      //
      // We reach this branch when performing a MODIFY-only, or when performing a CREATE | MODIFY
      // in which we determined above that there's a node of a different type blocking the
      // exchange.

      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_EXCHANGE)) {
        case ENOSYS:  // Syscall not supported by kernel.
        case EINVAL:  // Maybe we screwed up, or maybe the syscall is not supported by the
                      // filesystem. Unfortunately, there's no way to tell, so assume the latter.
                      // ZFS in particular apparently produces EINVAL.
          break;  // fall back to traditional means
        case ENOENT:
          // Presumably because the target path doesn't exist.
          if (has(mode, WriteMode::CREATE)) {
            KJ_FAIL_ASSERT("rename(tmp, path) claimed path exists but "
                "renameat2(fromPath, toPath, EXCHANGE) said it doesn't; concurrent modification?",
                fromPath, toPath) { return false; }
          } else {
            // Assume target doesn't exist.
            return false;
          }
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, EXCHANGE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        // Successful swap! Delete swapped-out content.
        rmrf(fromDirFd, fromPath);
        return true;
      }
    } else if (has(mode, WriteMode::CREATE)) {
      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_NOREPLACE)) {
        case ENOSYS:  // Syscall not supported by kernel.
        case EINVAL:  // Maybe we screwed up, or maybe the syscall is not supported by the
                      // filesystem. Unfortunately, there's no way to tell, so assume the latter.
                      // ZFS in particular apparently produces EINVAL.
          break;  // fall back to traditional means
        case EEXIST:
          return false;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, NOREPLACE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }
#endif

    // We're unable to do what we wanted atomically. :(

    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // We failed to atomically delete the target previously. So now we need to do two calls in
      // rapid succession to move the old file away then move the new one into place.

      // Find out what kind of file exists at the target path.
      struct stat stats;
      KJ_SYSCALL(fstatat(fd, toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) { return false; }

      // Create a temporary location to move the existing object to. Note that rename() allows a
      // non-directory to replace a non-directory, and allows a directory to replace an empty
      // directory. So we have to create the right type.
      Path toPathParsed = Path::parse(toPath);
      String away = createNamedTemporary(toPathParsed, WriteMode::CREATE,
          [&](StringPtr candidatePath) {
        if (S_ISDIR(stats.st_mode)) {
          return mkdirat(fd, candidatePath.cStr(), 0700);
        } else {
#if __APPLE__ || __FreeBSD__
          // - No mknodat() on OSX, gotta open() a file, ugh.
          // - On a modern FreeBSD, mknodat() is reserved strictly for device nodes,
          //   you cannot create a regular file using it (EINVAL).
          int newFd = openat(fd, candidatePath.cStr(),
                             O_RDWR | O_CREAT | O_EXCL | MAYBE_O_CLOEXEC, 0700);
          if (newFd >= 0) close(newFd);
          return newFd;
#else
          return mknodat(fd, candidatePath.cStr(), S_IFREG | 0600, dev_t());
#endif
        }
      });

      // OK, now move the target object to replace the thing we just created.
      KJ_SYSCALL(renameat(fd, toPath.cStr(), fd, away.cStr())) {
        // Something went wrong. Remove the thing we just created.
        unlinkat(fd, away.cStr(), S_ISDIR(stats.st_mode) ? AT_REMOVEDIR : 0);
        return false;
      }

      // Now move the source object to the target location.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd, toPath.cStr())) {
        default:
          // Try to put things back where they were. If this fails, though, then we have little
          // choice but to leave things broken.
          KJ_SYSCALL_HANDLE_ERRORS(renameat(fd, away.cStr(), fd, toPath.cStr())) {
            default: break;
          }

          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      }

      // OK, success. Delete the old content.
      rmrf(fd, away);
      return true;
    } else {
      // Only one of CREATE or MODIFY is specified, so we need to verify non-atomically that the
      // corresponding precondition (must-not-exist or must-exist, respectively) is held.
      if (has(mode, WriteMode::CREATE)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            break;  // doesn't exist; continue
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          return false;  // already exists; fail
        }
      } else if (has(mode, WriteMode::MODIFY)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            return false;  // doesn't exist; fail
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          // already exists; continue
        }
      } else {
        // Neither CREATE nor MODIFY.
        return false;
      }

      // Start over in create-and-modify mode.
      return tryCommitReplacement(toPath, fromDirFd, fromPath,
                                  WriteMode::CREATE | WriteMode::MODIFY,
                                  errorReason);
    }
  }